

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

int FindAndDelete(CScript *script,CScript *b)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  const_iterator cVar6;
  const_iterator last;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  CScript result;
  opcodetype local_64;
  const_iterator local_60;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (b->super_CScriptBase)._size;
  uVar2 = uVar3 - 0x1d;
  if (uVar3 < 0x1d) {
    uVar2 = uVar3;
  }
  if (uVar2 == 0) {
    iVar4 = 0;
  }
  else {
    local_58._16_8_ = 0;
    stack0xffffffffffffffc0 = 0;
    local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    local_58._8_8_ = 0;
    uVar3 = (script->super_CScriptBase)._size;
    uVar2 = uVar3 - 0x1d;
    cVar6.ptr = (uchar *)*(CScript **)&(script->super_CScriptBase)._union;
    if (uVar3 < 0x1d) {
      uVar2 = uVar3;
      cVar6.ptr = (uchar *)script;
    }
    last.ptr = (uchar *)((long)&(((CScript *)cVar6.ptr)->super_CScriptBase)._union +
                        (long)(int)uVar2);
    iVar4 = 0;
    local_60.ptr = cVar6.ptr;
    do {
      uVar3 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar3 = uStack_3c;
      }
      ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      if (uStack_3c < 0x1d) {
        ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
                 (uchar *)((long)&ppVar5->_union + (long)(int)uVar3),cVar6,local_60);
      uVar3 = (b->super_CScriptBase)._size;
      while( true ) {
        uVar2 = uVar3 - 0x1d;
        if (uVar3 < 0x1d) {
          uVar2 = uVar3;
        }
        if ((ulong)(long)((int)last.ptr - (int)local_60.ptr) < (ulong)uVar2) break;
        cVar6.ptr = (uchar *)b;
        if (0x1c < uVar3) {
          cVar6.ptr = (uchar *)(b->super_CScriptBase)._union.indirect_contents.indirect;
        }
        bVar1 = std::__equal<false>::
                equal<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                          (cVar6,(const_iterator)(cVar6.ptr + (int)uVar2),local_60);
        if (!bVar1) break;
        uVar3 = (b->super_CScriptBase)._size;
        uVar2 = uVar3 - 0x1d;
        if (uVar3 < 0x1d) {
          uVar2 = uVar3;
        }
        local_60.ptr = local_60.ptr + uVar2;
        iVar4 = iVar4 + 1;
      }
      cVar6.ptr = local_60.ptr;
      bVar1 = CScript::GetOp(script,&local_60,&local_64);
    } while (bVar1);
    if (0 < iVar4) {
      uVar3 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar3 = uStack_3c;
      }
      ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      if (uStack_3c < 0x1d) {
        ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
                 (uchar *)((long)&ppVar5->_union + (long)(int)uVar3),cVar6,last);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&script->super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int FindAndDelete(CScript& script, const CScript& b)
{
    int nFound = 0;
    if (b.empty())
        return nFound;
    CScript result;
    CScript::const_iterator pc = script.begin(), pc2 = script.begin(), end = script.end();
    opcodetype opcode;
    do
    {
        result.insert(result.end(), pc2, pc);
        while (static_cast<size_t>(end - pc) >= b.size() && std::equal(b.begin(), b.end(), pc))
        {
            pc = pc + b.size();
            ++nFound;
        }
        pc2 = pc;
    }
    while (script.GetOp(pc, opcode));

    if (nFound > 0) {
        result.insert(result.end(), pc2, end);
        script = std::move(result);
    }

    return nFound;
}